

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O3

uint8_t * __thiscall llvm::MD5::body(MD5 *this,ArrayRef<unsigned_char> Data)

{
  MD5_u32plus MVar1;
  MD5_u32plus MVar2;
  MD5_u32plus MVar3;
  MD5_u32plus MVar4;
  MD5_u32plus MVar5;
  MD5_u32plus MVar6;
  MD5_u32plus MVar7;
  MD5_u32plus MVar8;
  MD5_u32plus MVar9;
  MD5_u32plus MVar10;
  MD5_u32plus MVar11;
  MD5_u32plus MVar12;
  MD5_u32plus MVar13;
  MD5_u32plus MVar14;
  MD5_u32plus MVar15;
  MD5_u32plus MVar16;
  uint uVar17;
  uint uVar18;
  size_type sVar19;
  MD5_u32plus *pMVar20;
  MD5_u32plus MVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  MD5_u32plus MVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  
  sVar19 = Data.Length;
  pMVar20 = (MD5_u32plus *)Data.Data;
  MVar25 = this->a;
  uVar24 = this->b;
  MVar21 = this->c;
  uVar18 = this->d;
  do {
    MVar1 = *pMVar20;
    this->block[0] = MVar1;
    uVar17 = ((MVar21 ^ uVar18) & uVar24 ^ uVar18) + MVar25 + MVar1 + 0xd76aa478;
    uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar24;
    MVar2 = pMVar20[1];
    uVar26 = ((uVar24 ^ MVar21) & uVar17 ^ MVar21) + uVar18 + MVar2 + 0xe8c7b756;
    this->block[1] = MVar2;
    uVar27 = (uVar26 * 0x1000 | uVar26 >> 0x14) + uVar17;
    MVar3 = pMVar20[2];
    this->block[2] = MVar3;
    uVar26 = ((uVar17 ^ uVar24) & uVar27 ^ uVar24) + MVar21 + MVar3 + 0x242070db;
    uVar26 = (uVar26 * 0x20000 | uVar26 >> 0xf) + uVar27;
    MVar4 = pMVar20[3];
    this->block[3] = MVar4;
    uVar22 = MVar4 + uVar24 + ((uVar27 ^ uVar17) & uVar26 ^ uVar17) + 0xc1bdceee;
    uVar23 = (uVar22 * 0x400000 | uVar22 >> 10) + uVar26;
    MVar5 = pMVar20[4];
    this->block[4] = MVar5;
    uVar17 = uVar17 + MVar5 + ((uVar26 ^ uVar27) & uVar23 ^ uVar27) + 0xf57c0faf;
    uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar23;
    MVar6 = pMVar20[5];
    uVar22 = uVar27 + MVar6 + ((uVar23 ^ uVar26) & uVar17 ^ uVar26) + 0x4787c62a;
    this->block[5] = MVar6;
    uVar27 = (uVar22 * 0x1000 | uVar22 >> 0x14) + uVar17;
    MVar7 = pMVar20[6];
    this->block[6] = MVar7;
    uVar26 = uVar26 + MVar7 + ((uVar17 ^ uVar23) & uVar27 ^ uVar23) + 0xa8304613;
    uVar22 = (uVar26 * 0x20000 | uVar26 >> 0xf) + uVar27;
    MVar8 = pMVar20[7];
    uVar26 = ((uVar27 ^ uVar17) & uVar22 ^ uVar17) + uVar23 + MVar8 + 0xfd469501;
    this->block[7] = MVar8;
    uVar26 = (uVar26 * 0x400000 | uVar26 >> 10) + uVar22;
    MVar9 = pMVar20[8];
    uVar17 = uVar17 + MVar9 + ((uVar22 ^ uVar27) & uVar26 ^ uVar27) + 0x698098d8;
    this->block[8] = MVar9;
    uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar26;
    MVar10 = pMVar20[9];
    uVar23 = uVar27 + MVar10 + ((uVar26 ^ uVar22) & uVar17 ^ uVar22) + 0x8b44f7af;
    this->block[9] = MVar10;
    uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar17;
    MVar11 = pMVar20[10];
    uVar22 = (((uVar17 ^ uVar26) & uVar23 ^ uVar26) + uVar22 + MVar11) - 0xa44f;
    this->block[10] = MVar11;
    uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar23;
    MVar12 = pMVar20[0xb];
    uVar26 = ((uVar23 ^ uVar17) & uVar22 ^ uVar17) + uVar26 + MVar12 + 0x895cd7be;
    this->block[0xb] = MVar12;
    uVar27 = (uVar26 * 0x400000 | uVar26 >> 10) + uVar22;
    MVar13 = pMVar20[0xc];
    uVar17 = uVar17 + MVar13 + ((uVar22 ^ uVar23) & uVar27 ^ uVar23) + 0x6b901122;
    this->block[0xc] = MVar13;
    uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar27;
    MVar14 = pMVar20[0xd];
    uVar26 = ((uVar27 ^ uVar22) & uVar17 ^ uVar22) + uVar23 + MVar14 + 0xfd987193;
    this->block[0xd] = MVar14;
    uVar23 = (uVar26 * 0x1000 | uVar26 >> 0x14) + uVar17;
    MVar15 = pMVar20[0xe];
    uVar26 = uVar22 + MVar15 + ((uVar17 ^ uVar27) & uVar23 ^ uVar27) + 0xa679438e;
    this->block[0xe] = MVar15;
    uVar26 = (uVar26 * 0x20000 | uVar26 >> 0xf) + uVar23;
    MVar16 = pMVar20[0xf];
    uVar22 = uVar27 + MVar16 + ((uVar23 ^ uVar17) & uVar26 ^ uVar17) + 0x49b40821;
    uVar28 = (uVar22 * 0x400000 | uVar22 >> 10) + uVar26;
    uVar17 = ((uVar28 ^ uVar26) & uVar23 ^ uVar26) + uVar17 + MVar2 + 0xf61e2562;
    uVar27 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar28;
    uVar17 = uVar23 + MVar7 + ((uVar27 ^ uVar28) & uVar26 ^ uVar28) + 0xc040b340;
    uVar22 = (uVar17 * 0x200 | uVar17 >> 0x17) + uVar27;
    uVar17 = ((uVar22 ^ uVar27) & uVar28 ^ uVar27) + uVar26 + MVar12 + 0x265e5a51;
    uVar17 = (uVar17 * 0x4000 | uVar17 >> 0x12) + uVar22;
    uVar26 = ((uVar17 ^ uVar22) & uVar27 ^ uVar22) + uVar28 + MVar1 + 0xe9b6c7aa;
    uVar26 = (uVar26 * 0x100000 | uVar26 >> 0xc) + uVar17;
    uVar23 = uVar27 + MVar6 + ((uVar26 ^ uVar17) & uVar22 ^ uVar17) + 0xd62f105d;
    uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar26;
    uVar22 = ((uVar23 ^ uVar26) & uVar17 ^ uVar26) + uVar22 + MVar11 + 0x2441453;
    uVar27 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar23;
    uVar17 = ((uVar27 ^ uVar23) & uVar26 ^ uVar23) + uVar17 + MVar16 + 0xd8a1e681;
    uVar22 = (uVar17 * 0x4000 | uVar17 >> 0x12) + uVar27;
    uVar17 = uVar26 + MVar5 + ((uVar22 ^ uVar27) & uVar23 ^ uVar27) + 0xe7d3fbc8;
    uVar26 = (uVar17 * 0x100000 | uVar17 >> 0xc) + uVar22;
    uVar17 = ((uVar26 ^ uVar22) & uVar27 ^ uVar22) + uVar23 + MVar10 + 0x21e1cde6;
    uVar17 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar26;
    uVar23 = uVar27 + MVar15 + ((uVar17 ^ uVar26) & uVar22 ^ uVar26) + 0xc33707d6;
    uVar27 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar17;
    uVar22 = uVar22 + MVar4 + ((uVar27 ^ uVar17) & uVar26 ^ uVar17) + 0xf4d50d87;
    uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar27;
    uVar26 = ((uVar22 ^ uVar27) & uVar17 ^ uVar27) + uVar26 + MVar9 + 0x455a14ed;
    uVar23 = (uVar26 * 0x100000 | uVar26 >> 0xc) + uVar22;
    uVar17 = uVar17 + MVar14 + ((uVar23 ^ uVar22) & uVar27 ^ uVar22) + 0xa9e3e905;
    uVar17 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar23;
    uVar26 = uVar27 + MVar3 + ((uVar17 ^ uVar23) & uVar22 ^ uVar23) + 0xfcefa3f8;
    uVar27 = (uVar26 * 0x200 | uVar26 >> 0x17) + uVar17;
    uVar26 = uVar22 + MVar8 + ((uVar27 ^ uVar17) & uVar23 ^ uVar17) + 0x676f02d9;
    uVar26 = (uVar26 * 0x4000 | uVar26 >> 0x12) + uVar27;
    uVar22 = uVar23 + MVar13 + ((uVar26 ^ uVar27) & uVar17 ^ uVar27) + 0x8d2a4c8a;
    uVar22 = (uVar22 * 0x100000 | uVar22 >> 0xc) + uVar26;
    uVar17 = (uVar17 + MVar6 + (uVar26 ^ uVar27 ^ uVar22)) - 0x5c6be;
    uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar22;
    uVar23 = uVar27 + MVar9 + (uVar22 ^ uVar26 ^ uVar17) + 0x8771f681;
    uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar17;
    uVar26 = (uVar17 ^ uVar22 ^ uVar23) + uVar26 + MVar12 + 0x6d9d6122;
    uVar26 = (uVar26 * 0x10000 | uVar26 >> 0x10) + uVar23;
    uVar22 = uVar22 + MVar15 + (uVar23 ^ uVar17 ^ uVar26) + 0xfde5380c;
    uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar26;
    uVar17 = uVar17 + MVar2 + (uVar26 ^ uVar23 ^ uVar22) + 0xa4beea44;
    uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar22;
    uVar23 = uVar23 + MVar5 + (uVar22 ^ uVar26 ^ uVar17) + 0x4bdecfa9;
    uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar17;
    uVar26 = uVar26 + MVar8 + (uVar17 ^ uVar22 ^ uVar23) + 0xf6bb4b60;
    uVar26 = (uVar26 * 0x10000 | uVar26 >> 0x10) + uVar23;
    uVar22 = uVar22 + MVar11 + (uVar23 ^ uVar17 ^ uVar26) + 0xbebfbc70;
    uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar26;
    uVar17 = uVar17 + MVar14 + (uVar26 ^ uVar23 ^ uVar22) + 0x289b7ec6;
    uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar22;
    uVar23 = uVar23 + MVar1 + (uVar22 ^ uVar26 ^ uVar17) + 0xeaa127fa;
    uVar27 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar17;
    uVar26 = (uVar17 ^ uVar22 ^ uVar27) + uVar26 + MVar4 + 0xd4ef3085;
    uVar26 = (uVar26 * 0x10000 | uVar26 >> 0x10) + uVar27;
    uVar22 = uVar22 + MVar7 + (uVar27 ^ uVar17 ^ uVar26) + 0x4881d05;
    uVar23 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar26;
    uVar17 = (uVar26 ^ uVar27 ^ uVar23) + uVar17 + MVar10 + 0xd9d4d039;
    uVar22 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar23;
    uVar17 = uVar27 + MVar13 + (uVar23 ^ uVar26 ^ uVar22) + 0xe6db99e5;
    uVar28 = (uVar17 * 0x800 | uVar17 >> 0x15) + uVar22;
    uVar17 = uVar26 + MVar16 + (uVar22 ^ uVar23 ^ uVar28) + 0x1fa27cf8;
    uVar26 = (uVar17 * 0x10000 | uVar17 >> 0x10) + uVar28;
    uVar17 = (uVar28 ^ uVar22 ^ uVar26) + uVar23 + MVar3 + 0xc4ac5665;
    uVar17 = (uVar17 * 0x800000 | uVar17 >> 9) + uVar26;
    uVar22 = ((~uVar28 | uVar17) ^ uVar26) + uVar22 + MVar1 + 0xf4292244;
    uVar27 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar17;
    uVar22 = ((~uVar26 | uVar27) ^ uVar17) + uVar28 + MVar8 + 0x432aff97;
    uVar23 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar27;
    uVar26 = ((~uVar17 | uVar23) ^ uVar27) + uVar26 + MVar15 + 0xab9423a7;
    uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar23;
    uVar17 = uVar17 + MVar6 + ((~uVar27 | uVar26) ^ uVar23) + 0xfc93a039;
    uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar26;
    uVar22 = ((~uVar23 | uVar17) ^ uVar26) + uVar27 + MVar13 + 0x655b59c3;
    uVar22 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar17;
    uVar23 = uVar23 + MVar4 + ((~uVar26 | uVar22) ^ uVar17) + 0x8f0ccc92;
    uVar23 = (uVar23 * 0x400 | uVar23 >> 0x16) + uVar22;
    uVar26 = (uVar26 + MVar11 + ((~uVar17 | uVar23) ^ uVar22)) - 0x100b83;
    uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar23;
    uVar17 = ((~uVar22 | uVar26) ^ uVar23) + uVar17 + MVar2 + 0x85845dd1;
    uVar28 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar26;
    uVar17 = ((~uVar23 | uVar28) ^ uVar26) + uVar22 + MVar9 + 0x6fa87e4f;
    uVar27 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar28;
    uVar17 = ((~uVar26 | uVar27) ^ uVar28) + uVar23 + MVar16 + 0xfe2ce6e0;
    uVar17 = (uVar17 * 0x400 | uVar17 >> 0x16) + uVar27;
    uVar26 = ((~uVar28 | uVar17) ^ uVar27) + uVar26 + MVar7 + 0xa3014314;
    uVar22 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar17;
    uVar26 = ((~uVar27 | uVar22) ^ uVar17) + uVar28 + MVar14 + 0x4e0811a1;
    uVar26 = (uVar26 * 0x200000 | uVar26 >> 0xb) + uVar22;
    uVar23 = ((~uVar17 | uVar26) ^ uVar22) + uVar27 + MVar5 + 0xf7537e82;
    this->block[0xf] = MVar16;
    uVar23 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar26;
    uVar17 = uVar17 + MVar12 + ((~uVar22 | uVar23) ^ uVar26) + 0xbd3af235;
    uVar17 = (uVar17 * 0x400 | uVar17 >> 0x16) + uVar23;
    uVar22 = uVar22 + MVar3 + ((~uVar26 | uVar17) ^ uVar23) + 0x2ad7d2bb;
    uVar22 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar17;
    uVar26 = uVar26 + MVar10 + ((~uVar23 | uVar22) ^ uVar17) + 0xeb86d391;
    MVar25 = uVar23 + MVar25;
    uVar24 = uVar24 + uVar22 + (uVar26 * 0x200000 | uVar26 >> 0xb);
    MVar21 = uVar22 + MVar21;
    uVar18 = uVar17 + uVar18;
    pMVar20 = pMVar20 + 0x10;
    sVar19 = sVar19 - 0x40;
  } while (sVar19 != 0);
  this->a = MVar25;
  this->b = uVar24;
  this->c = MVar21;
  this->d = uVar18;
  return (uint8_t *)pMVar20;
}

Assistant:

const uint8_t *MD5::body(ArrayRef<uint8_t> Data) {
  const uint8_t *ptr;
  MD5_u32plus a, b, c, d;
  MD5_u32plus saved_a, saved_b, saved_c, saved_d;
  unsigned long Size = Data.size();

  ptr = Data.data();

  a = this->a;
  b = this->b;
  c = this->c;
  d = this->d;

  do {
    saved_a = a;
    saved_b = b;
    saved_c = c;
    saved_d = d;

    // Round 1
    STEP(F, a, b, c, d, SET(0), 0xd76aa478, 7)
    STEP(F, d, a, b, c, SET(1), 0xe8c7b756, 12)
    STEP(F, c, d, a, b, SET(2), 0x242070db, 17)
    STEP(F, b, c, d, a, SET(3), 0xc1bdceee, 22)
    STEP(F, a, b, c, d, SET(4), 0xf57c0faf, 7)
    STEP(F, d, a, b, c, SET(5), 0x4787c62a, 12)
    STEP(F, c, d, a, b, SET(6), 0xa8304613, 17)
    STEP(F, b, c, d, a, SET(7), 0xfd469501, 22)
    STEP(F, a, b, c, d, SET(8), 0x698098d8, 7)
    STEP(F, d, a, b, c, SET(9), 0x8b44f7af, 12)
    STEP(F, c, d, a, b, SET(10), 0xffff5bb1, 17)
    STEP(F, b, c, d, a, SET(11), 0x895cd7be, 22)
    STEP(F, a, b, c, d, SET(12), 0x6b901122, 7)
    STEP(F, d, a, b, c, SET(13), 0xfd987193, 12)
    STEP(F, c, d, a, b, SET(14), 0xa679438e, 17)
    STEP(F, b, c, d, a, SET(15), 0x49b40821, 22)

    // Round 2
    STEP(G, a, b, c, d, GET(1), 0xf61e2562, 5)
    STEP(G, d, a, b, c, GET(6), 0xc040b340, 9)
    STEP(G, c, d, a, b, GET(11), 0x265e5a51, 14)
    STEP(G, b, c, d, a, GET(0), 0xe9b6c7aa, 20)
    STEP(G, a, b, c, d, GET(5), 0xd62f105d, 5)
    STEP(G, d, a, b, c, GET(10), 0x02441453, 9)
    STEP(G, c, d, a, b, GET(15), 0xd8a1e681, 14)
    STEP(G, b, c, d, a, GET(4), 0xe7d3fbc8, 20)
    STEP(G, a, b, c, d, GET(9), 0x21e1cde6, 5)
    STEP(G, d, a, b, c, GET(14), 0xc33707d6, 9)
    STEP(G, c, d, a, b, GET(3), 0xf4d50d87, 14)
    STEP(G, b, c, d, a, GET(8), 0x455a14ed, 20)
    STEP(G, a, b, c, d, GET(13), 0xa9e3e905, 5)
    STEP(G, d, a, b, c, GET(2), 0xfcefa3f8, 9)
    STEP(G, c, d, a, b, GET(7), 0x676f02d9, 14)
    STEP(G, b, c, d, a, GET(12), 0x8d2a4c8a, 20)

    // Round 3
    STEP(H, a, b, c, d, GET(5), 0xfffa3942, 4)
    STEP(H, d, a, b, c, GET(8), 0x8771f681, 11)
    STEP(H, c, d, a, b, GET(11), 0x6d9d6122, 16)
    STEP(H, b, c, d, a, GET(14), 0xfde5380c, 23)
    STEP(H, a, b, c, d, GET(1), 0xa4beea44, 4)
    STEP(H, d, a, b, c, GET(4), 0x4bdecfa9, 11)
    STEP(H, c, d, a, b, GET(7), 0xf6bb4b60, 16)
    STEP(H, b, c, d, a, GET(10), 0xbebfbc70, 23)
    STEP(H, a, b, c, d, GET(13), 0x289b7ec6, 4)
    STEP(H, d, a, b, c, GET(0), 0xeaa127fa, 11)
    STEP(H, c, d, a, b, GET(3), 0xd4ef3085, 16)
    STEP(H, b, c, d, a, GET(6), 0x04881d05, 23)
    STEP(H, a, b, c, d, GET(9), 0xd9d4d039, 4)
    STEP(H, d, a, b, c, GET(12), 0xe6db99e5, 11)
    STEP(H, c, d, a, b, GET(15), 0x1fa27cf8, 16)
    STEP(H, b, c, d, a, GET(2), 0xc4ac5665, 23)

    // Round 4
    STEP(I, a, b, c, d, GET(0), 0xf4292244, 6)
    STEP(I, d, a, b, c, GET(7), 0x432aff97, 10)
    STEP(I, c, d, a, b, GET(14), 0xab9423a7, 15)
    STEP(I, b, c, d, a, GET(5), 0xfc93a039, 21)
    STEP(I, a, b, c, d, GET(12), 0x655b59c3, 6)
    STEP(I, d, a, b, c, GET(3), 0x8f0ccc92, 10)
    STEP(I, c, d, a, b, GET(10), 0xffeff47d, 15)
    STEP(I, b, c, d, a, GET(1), 0x85845dd1, 21)
    STEP(I, a, b, c, d, GET(8), 0x6fa87e4f, 6)
    STEP(I, d, a, b, c, GET(15), 0xfe2ce6e0, 10)
    STEP(I, c, d, a, b, GET(6), 0xa3014314, 15)
    STEP(I, b, c, d, a, GET(13), 0x4e0811a1, 21)
    STEP(I, a, b, c, d, GET(4), 0xf7537e82, 6)
    STEP(I, d, a, b, c, GET(11), 0xbd3af235, 10)
    STEP(I, c, d, a, b, GET(2), 0x2ad7d2bb, 15)
    STEP(I, b, c, d, a, GET(9), 0xeb86d391, 21)

    a += saved_a;
    b += saved_b;
    c += saved_c;
    d += saved_d;

    ptr += 64;
  } while (Size -= 64);

  this->a = a;
  this->b = b;
  this->c = c;
  this->d = d;

  return ptr;
}